

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# writer_test.cc
# Opt level: O1

void __thiscall
writer_test_should_write_int_field_Test::TestBody(writer_test_should_write_int_field_Test *this)

{
  bool bVar1;
  size_t __n;
  char *message;
  ostringstream local_1d8 [8];
  ostringstream oss;
  ios_base local_168 [264];
  undefined8 local_60;
  Field field;
  AssertionResult gtest_ar;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_30;
  AssertHelper local_20;
  
  local_60 = 0x19;
  field.val_._0_1_ = 0;
  std::__cxx11::ostringstream::ostringstream(local_1d8);
  Fixpp::details::FieldWriter<Fixpp::Field<Fixpp::TagT<34U,_Fixpp::Type::Int>_>_>::write
            ((int)local_1d8,&local_60,__n);
  std::__cxx11::stringbuf::str();
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[7]>
            ((internal *)&field.empty_,"oss.str()","\"34=25|\"",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar.message_
             ,(char (*) [7])"34=25|");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)gtest_ar.message_.ptr_ != &local_30) {
    operator_delete(gtest_ar.message_.ptr_,local_30._M_allocated_capacity + 1);
  }
  if (field.empty_ == false) {
    testing::Message::Message((Message *)&gtest_ar.message_);
    if (gtest_ar._0_8_ == 0) {
      message = "";
    }
    else {
      message = *(char **)gtest_ar._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_20,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/Abc-Arbitrage[P]fixpp/tests/writer_test.cc"
               ,0xc5,message);
    testing::internal::AssertHelper::operator=(&local_20,(Message *)&gtest_ar.message_);
    testing::internal::AssertHelper::~AssertHelper(&local_20);
    if (gtest_ar.message_.ptr_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (gtest_ar.message_.ptr_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(((gtest_ar.message_.ptr_)->_M_dataplus)._M_p + 8))();
      }
      gtest_ar.message_.ptr_ =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  std::__cxx11::ostringstream::~ostringstream(local_1d8);
  std::ios_base::~ios_base(local_168);
  return;
}

Assistant:

TEST(writer_test, should_write_int_field)
{
    using Field = Fixpp::Field<Fixpp::Tag::MsgSeqNum>;
    Field field;
    field.set(25);

    std::ostringstream oss;
    writeField(oss, field);

    ASSERT_EQ(oss.str(), "34=25|");
}